

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# confparse.cpp
# Opt level: O0

int __thiscall Confparse::ParseInt(Confparse *this,char *key,int defaultv)

{
  char *pcVar1;
  long lVar2;
  int *piVar3;
  int in_EDX;
  char *unaff_retaddr;
  Confparse *in_stack_00000008;
  int v;
  char *p;
  int local_4;
  
  pcVar1 = Parse(in_stack_00000008,unaff_retaddr);
  local_4 = in_EDX;
  if (pcVar1 != (char *)0x0) {
    pcVar1 = Parse(in_stack_00000008,unaff_retaddr);
    lVar2 = strtol(pcVar1,(char **)0x0,10);
    local_4 = (int)lVar2;
    piVar3 = __errno_location();
    if (*piVar3 == 0x22) {
      local_4 = in_EDX;
    }
  }
  return local_4;
}

Assistant:

int Confparse::ParseInt(const char *key, int defaultv) {
	char *p = Parse(key);
	if (p) {
		int v = strtol((char *)Parse(key), NULL, 10);
		if (errno == ERANGE)
			return defaultv;
		else
			return v;
	} else
		return defaultv;
}